

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int check_msa_access(DisasContext_conflict6 *ctx)

{
  bool bVar1;
  DisasContext_conflict6 *ctx_local;
  
  bVar1 = false;
  if ((ctx->hflags & 0x20) != 0) {
    bVar1 = (ctx->hflags & 0x40) == 0;
  }
  if (bVar1) {
    generate_exception_end(ctx,0x14);
    ctx_local._4_4_ = 0;
  }
  else if ((ctx->hflags & 0x1000000) == 0) {
    if ((ctx->insn_flags & 0x20000000000) == 0) {
      generate_exception_end(ctx,0x14);
      ctx_local._4_4_ = 0;
    }
    else {
      generate_exception_end(ctx,0x22);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int check_msa_access(DisasContext *ctx)
{
    if (unlikely((ctx->hflags & MIPS_HFLAG_FPU) &&
                 !(ctx->hflags & MIPS_HFLAG_F64))) {
        generate_exception_end(ctx, EXCP_RI);
        return 0;
    }

    if (unlikely(!(ctx->hflags & MIPS_HFLAG_MSA))) {
        if (ctx->insn_flags & ASE_MSA) {
            generate_exception_end(ctx, EXCP_MSADIS);
            return 0;
        } else {
            generate_exception_end(ctx, EXCP_RI);
            return 0;
        }
    }
    return 1;
}